

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config.c
# Opt level: O0

int katherine_set_seq_readout_start(katherine_device_t *device,int arg)

{
  int local_20;
  int res;
  int arg_local;
  katherine_device_t *device_local;
  
  local_20 = katherine_udp_mutex_lock(&device->control_socket);
  if ((local_20 == 0) &&
     (local_20 = katherine_cmd_set_seq_readout_start(&device->control_socket,(long)arg),
     local_20 == 0)) {
    katherine_udp_mutex_unlock(&device->control_socket);
    device_local._4_4_ = 0;
  }
  else {
    katherine_udp_mutex_unlock(&device->control_socket);
    device_local._4_4_ = local_20;
  }
  return device_local._4_4_;
}

Assistant:

int
katherine_set_seq_readout_start(katherine_device_t *device, int arg)
{
    int res;

    res = katherine_udp_mutex_lock(&device->control_socket);
    if (res) goto err;

    res = katherine_cmd_set_seq_readout_start(&device->control_socket, arg);
    if (res) goto err;

    /* Note: this command does _not_ produce an acknowledgement. */

    (void) katherine_udp_mutex_unlock(&device->control_socket);
    return 0;

err:
    (void) katherine_udp_mutex_unlock(&device->control_socket);
    return res;
}